

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

string * __thiscall
args::EitherFlag::str
          (string *__return_storage_ptr__,EitherFlag *this,string *shortPrefix,string *longPrefix)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (this->isShort == true) {
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct((ulong)local_40,'\x01');
    plVar2 = (long *)std::__cxx11::string::replace
                               ((ulong)local_40,0,(char *)0x0,(ulong)(shortPrefix->_M_dataplus)._M_p
                               );
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar3 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar3) {
      lVar1 = plVar2[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
    }
    __return_storage_ptr__->_M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
  }
  else {
    std::operator+(__return_storage_ptr__,longPrefix,&this->longFlag);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string str(const std::string &shortPrefix, const std::string &longPrefix) const
        {
            return isShort ? shortPrefix + std::string(1, shortFlag) : longPrefix + longFlag;
        }